

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O0

bool __thiscall tinyusdz::usdc::USDCReader::Impl::ToLayer(Impl *this,Layer *layer)

{
  bool bVar1;
  ostream *poVar2;
  size_t sVar3;
  vector<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_> *__x;
  vector<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_> *__x_00;
  vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_> *__x_01;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *pvVar4;
  map<tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>,_std::less<tinyusdz::crate::Index>,_std::allocator<std::pair<const_tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>_>_>_>
  *pmVar5;
  size_type sVar6;
  reference pvVar7;
  size_type sVar8;
  mapped_type *pmVar9;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
  *this_00;
  string local_6e8;
  ostringstream local_6c8 [8];
  ostringstream ss_e_2;
  bool ret;
  int root_node_id;
  ostringstream local_520 [8];
  ostringstream ss_e_1;
  ulong local_3a8;
  size_t i;
  PathIndexToSpecIndexMap path_index_to_spec_index_map;
  string local_350;
  ostringstream local_330 [8];
  ostringstream ss_w;
  string local_1b8;
  ostringstream local_198 [8];
  ostringstream ss_e;
  Layer *layer_local;
  Impl *this_local;
  
  if (layer == (Layer *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream(local_198);
    poVar2 = ::std::operator<<((ostream *)local_198,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ToLayer");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xe8e);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_198,"`layer` argument is nullptr.");
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,&local_1b8);
    ::std::__cxx11::string::~string((string *)&local_1b8);
    this_local._7_1_ = false;
    ::std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  else {
    sVar3 = crate::CrateReader::NumNodes(this->crate_reader);
    if (sVar3 == 0) {
      ::std::__cxx11::ostringstream::ostringstream(local_330);
      poVar2 = ::std::operator<<((ostream *)local_330,"[warn]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ToLayer");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xe95);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)local_330,"Empty scene.");
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::ostringstream::str();
      PushWarn(this,&local_350);
      ::std::__cxx11::string::~string((string *)&local_350);
      ::std::__cxx11::ostringstream::~ostringstream(local_330);
      this_local._7_1_ = true;
    }
    else {
      crate::CrateReader::GetNodes
                ((vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                  *)&path_index_to_spec_index_map._M_h._M_single_bucket,this->crate_reader);
      ::std::
      vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
      ::operator=(&this->_nodes,
                  (vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                   *)&path_index_to_spec_index_map._M_h._M_single_bucket);
      ::std::
      vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
      ::~vector((vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
                 *)&path_index_to_spec_index_map._M_h._M_single_bucket);
      __x = crate::CrateReader::GetSpecs(this->crate_reader);
      ::std::vector<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>::operator=
                (&this->_specs,__x);
      __x_00 = crate::CrateReader::GetFields(this->crate_reader);
      ::std::vector<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>::operator=
                (&this->_fields,__x_00);
      __x_01 = crate::CrateReader::GetFieldsetIndices(this->crate_reader);
      ::std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>::operator=
                (&this->_fieldset_indices,__x_01);
      pvVar4 = crate::CrateReader::GetPaths(this->crate_reader);
      std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&this->_paths,
                 (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)pvVar4);
      pvVar4 = crate::CrateReader::GetElemPaths(this->crate_reader);
      std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&this->_elemPaths,
                 (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)pvVar4);
      pmVar5 = crate::CrateReader::GetLiveFieldSets_abi_cxx11_(this->crate_reader);
      ::std::
      map<tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>,_std::less<tinyusdz::crate::Index>,_std::allocator<std::pair<const_tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>_>_>_>
      ::operator=(&this->_live_fieldsets,pmVar5);
      ::std::
      unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::unordered_map((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                       *)&i);
      for (local_3a8 = 0;
          sVar6 = ::std::vector<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>::size
                            (&this->_specs), local_3a8 < sVar6; local_3a8 = local_3a8 + 1) {
        pvVar7 = ::std::vector<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>::
                 operator[](&this->_specs,local_3a8);
        if ((pvVar7->path_index).value != 0xffffffff) {
          pvVar7 = ::std::vector<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>::
                   operator[](&this->_specs,local_3a8);
          sVar8 = ::std::
                  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  ::count((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                           *)&i,(key_type *)pvVar7);
          if (sVar8 != 0) {
            ::std::__cxx11::ostringstream::ostringstream(local_520);
            poVar2 = ::std::operator<<((ostream *)local_520,"[error]");
            poVar2 = ::std::operator<<(poVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                      );
            poVar2 = ::std::operator<<(poVar2,":");
            poVar2 = ::std::operator<<(poVar2,"ToLayer");
            poVar2 = ::std::operator<<(poVar2,"():");
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xead);
            ::std::operator<<(poVar2," ");
            poVar2 = ::std::operator<<((ostream *)local_520,
                                       "Multiple PathIndex found in Crate data.");
            ::std::operator<<(poVar2,"\n");
            ::std::__cxx11::ostringstream::str();
            PushError(this,(string *)&root_node_id);
            ::std::__cxx11::string::~string((string *)&root_node_id);
            this_local._7_1_ = false;
            ::std::__cxx11::ostringstream::~ostringstream(local_520);
            goto LAB_001f0cd5;
          }
          pvVar7 = ::std::vector<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>::
                   operator[](&this->_specs,local_3a8);
          pmVar9 = ::std::
                   unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   ::operator[]((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                 *)&i,(key_type *)pvVar7);
          *pmVar9 = (mapped_type)local_3a8;
        }
      }
      this_00 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
                 *)Layer::primspecs_abi_cxx11_(layer);
      ::std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
      ::clear(this_00);
      bVar1 = ReconstructPrimSpecRecursively
                        (this,-1,0,(PrimSpec *)0x0,0,(PathIndexToSpecIndexMap *)&i,layer);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_6c8);
        poVar2 = ::std::operator<<((ostream *)local_6c8,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ToLayer");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xebf);
        ::std::operator<<(poVar2," ");
        poVar2 = ::std::operator<<((ostream *)local_6c8,
                                   "Failed to reconstruct Layer(PrimSpec hierarchy)");
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_6e8);
        ::std::__cxx11::string::~string((string *)&local_6e8);
        this_local._7_1_ = false;
        ::std::__cxx11::ostringstream::~ostringstream(local_6c8);
      }
LAB_001f0cd5:
      ::std::
      unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::~unordered_map((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                        *)&i);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool USDCReader::Impl::ToLayer(Layer *layer) {

  if (!layer) {
    PUSH_ERROR_AND_RETURN("`layer` argument is nullptr.");
  }

  // format test
  DCOUT(fmt::format("# of Paths = {}", crate_reader->NumPaths()));

  if (crate_reader->NumNodes() == 0) {
    PUSH_WARN("Empty scene.");
    return true;
  }

  // TODO: Directly access data in crate_reader.
  _nodes = crate_reader->GetNodes();
  _specs = crate_reader->GetSpecs();
  _fields = crate_reader->GetFields();
  _fieldset_indices = crate_reader->GetFieldsetIndices();
  _paths = crate_reader->GetPaths();
  _elemPaths = crate_reader->GetElemPaths();
  _live_fieldsets = crate_reader->GetLiveFieldSets();

  PathIndexToSpecIndexMap
      path_index_to_spec_index_map;  // path_index -> spec_index

  {
    for (size_t i = 0; i < _specs.size(); i++) {
      if (_specs[i].path_index.value == ~0u) {
        continue;
      }

      // path_index should be unique.
      if (path_index_to_spec_index_map.count(_specs[i].path_index.value) != 0) {
        PUSH_ERROR_AND_RETURN("Multiple PathIndex found in Crate data.");
      }

      DCOUT(fmt::format("path index[{}] -> spec index [{}]",
                        _specs[i].path_index.value, uint32_t(i)));
      path_index_to_spec_index_map[_specs[i].path_index.value] = uint32_t(i);
    }
  }

  layer->primspecs().clear();

  int root_node_id = 0;
  bool ret = ReconstructPrimSpecRecursively(/* no further root for root_node */ -1,
                                        root_node_id, /* root Prim */ nullptr,
                                        /* level */ 0,
                                        path_index_to_spec_index_map, layer);

  if (!ret) {
    PUSH_ERROR_AND_RETURN("Failed to reconstruct Layer(PrimSpec hierarchy)");
  }

  //stage->compute_absolute_prim_path_and_assign_prim_id();

  return true;
}